

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall Assimp::ZipFile::ZipFile(ZipFile *this,size_t size)

{
  uchar *__p;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_20;
  size_t local_18;
  size_t size_local;
  ZipFile *this_local;
  
  local_18 = size;
  size_local = (size_t)this;
  IOStream::IOStream(&this->super_IOStream);
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__ZipFile_0111bd78;
  this->m_Size = local_18;
  this->m_SeekPtr = 0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->m_Buffer);
  if (this->m_Size != 0) {
    __p = (uchar *)operator_new__(this->m_Size);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_20,__p);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->m_Buffer,&local_20);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_20);
    return;
  }
  __assert_fail("m_Size != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0xf5,"Assimp::ZipFile::ZipFile(size_t)");
}

Assistant:

ZipFile::ZipFile(size_t size)
        : m_Size(size) {
        ai_assert(m_Size != 0);
        m_Buffer = std::unique_ptr<uint8_t[]>(new uint8_t[m_Size]);
    }